

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3DbStrNDup(sqlite3 *db,char *z,u64 n)

{
  char *zNew;
  u64 n_local;
  char *z_local;
  sqlite3 *db_local;
  
  if (z == (char *)0x0) {
    db_local = (sqlite3 *)0x0;
  }
  else {
    db_local = (sqlite3 *)sqlite3DbMallocRawNN(db,n + 1);
    if (db_local != (sqlite3 *)0x0) {
      memcpy(db_local,z,n);
      *(undefined1 *)((long)db_local->aLimit + (n - 0x7c)) = 0;
    }
  }
  return (char *)db_local;
}

Assistant:

SQLITE_PRIVATE char *sqlite3DbStrNDup(sqlite3 *db, const char *z, u64 n){
  char *zNew;
  assert( db!=0 );
  if( z==0 ){
    return 0;
  }
  assert( (n&0x7fffffff)==n );
  zNew = sqlite3DbMallocRawNN(db, n+1);
  if( zNew ){
    memcpy(zNew, z, (size_t)n);
    zNew[n] = 0;
  }
  return zNew;
}